

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall CClient::OnClientOnline(CClient *this)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  CServerInfo Info;
  
  Info.m_aClients[0x21].m_aName[4] = '\0';
  Info.m_aClients[0x21].m_aName[5] = '\0';
  Info.m_aClients[0x21].m_aName[6] = '\0';
  Info.m_aClients[0x21].m_aName[7] = '\0';
  Info.m_aClients[0x21].m_aName[8] = '\0';
  Info.m_aClients[0x21].m_aName[9] = '\0';
  Info.m_aClients[0x21].m_aName[10] = '\0';
  Info.m_aClients[0x21].m_aName[0xb] = '\0';
  Info.m_aClients[2].m_aName[0] = '\0';
  Info.m_aClients[2].m_aName[1] = '\0';
  Info.m_aClients[2].m_aName[2] = '\0';
  Info.m_aClients[2].m_aName[3] = '\0';
  Info.m_aClients[2].m_aName[4] = '\0';
  Info.m_aClients[2].m_aName[5] = '\0';
  Info.m_aClients[2].m_aName[6] = '\0';
  Info.m_aClients[2].m_aName[7] = '\0';
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->super_IClient).super_IInterface._vptr_IInterface[7])();
  memset(&Info,0,0x228c);
  (*(this->super_IClient).super_IInterface._vptr_IInterface[0x1d])(this,&Info);
  iVar1 = this->m_pConfig->m_ClSaveServerPasswords;
  if (((this->m_aServerPassword[0] != '\0') &&
      ((iVar1 != 2 & (iVar1 != 1 | Info.m_Favorite ^ 1U)) == 0)) && (((byte)Info.m_Flags & 1) != 0))
  {
    CServerBrowser::SetFavoritePassword
              (&this->m_ServerBrowser,this->m_aServerAddressStr,this->m_aServerPassword);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CClient::OnClientOnline()
{
	DemoRecorder_HandleAutoStart();

	// store password and server as favorite if configured, if the server was password protected
	CServerInfo Info = {0};
	GetServerInfo(&Info);
	bool ShouldStorePassword = Config()->m_ClSaveServerPasswords == 2 || (Config()->m_ClSaveServerPasswords == 1 && Info.m_Favorite);
	if(m_aServerPassword[0] && ShouldStorePassword && (Info.m_Flags&IServerBrowser::FLAG_PASSWORD))
	{
		m_ServerBrowser.SetFavoritePassword(m_aServerAddressStr, m_aServerPassword);
	}
}